

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwidget.cpp
# Opt level: O2

void __thiscall QOpenGLWidget::~QOpenGLWidget(QOpenGLWidget *this)

{
  ~QOpenGLWidget(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

QOpenGLWidget::~QOpenGLWidget()
{
    // NB! resetting graphics resources must be done from this destructor,
    // *not* from the private class' destructor. This is due to how destruction
    // works and due to the QWidget dtor (for toplevels) destroying the repaint
    // manager and rhi before the (QObject) private gets destroyed. Hence must
    // do it here early on.

    Q_D(QOpenGLWidget);
    d->reset();
}